

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_reactor.hpp
# Opt level: O0

void __thiscall
asio::detail::epoll_reactor::
schedule_timer<asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,asio::wait_traits<std::chrono::_V2::system_clock>>>
          (epoll_reactor *this,
          timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>_>_>
          *queue,time_type *time,per_timer_data *timer,wait_op *op)

{
  bool bVar1;
  bool earliest;
  undefined1 local_40 [8];
  scoped_lock lock;
  wait_op *op_local;
  per_timer_data *timer_local;
  time_type *time_local;
  timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>_>_>
  *queue_local;
  epoll_reactor *this_local;
  
  lock._8_8_ = op;
  scoped_lock<asio::detail::posix_mutex>::scoped_lock
            ((scoped_lock<asio::detail::posix_mutex> *)local_40,&this->mutex_);
  if ((this->shutdown_ & 1U) == 0) {
    bVar1 = timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>_>_>
            ::enqueue_timer(queue,time,timer,(wait_op *)lock._8_8_);
    scheduler::work_started(this->scheduler_);
    if (bVar1) {
      update_timeout(this);
    }
  }
  else {
    scheduler::post_immediate_completion(this->scheduler_,(operation *)lock._8_8_,false);
  }
  scoped_lock<asio::detail::posix_mutex>::~scoped_lock
            ((scoped_lock<asio::detail::posix_mutex> *)local_40);
  return;
}

Assistant:

void epoll_reactor::schedule_timer(timer_queue<Time_Traits>& queue,
    const typename Time_Traits::time_type& time,
    typename timer_queue<Time_Traits>::per_timer_data& timer, wait_op* op)
{
  mutex::scoped_lock lock(mutex_);

  if (shutdown_)
  {
    scheduler_.post_immediate_completion(op, false);
    return;
  }

  bool earliest = queue.enqueue_timer(time, timer, op);
  scheduler_.work_started();
  if (earliest)
    update_timeout();
}